

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O0

StringRef __thiscall llvm::AArch64::getArchExtFeature(AArch64 *this,StringRef ArchExt)

{
  char *pcVar1;
  unsigned_long *puVar2;
  AArch64 *pAVar3;
  bool bVar4;
  StringRef SVar5;
  bool local_259;
  char *local_248;
  char *local_240;
  anon_struct_40_5_444f9c93 *AE_1;
  anon_struct_40_5_444f9c93 *__end1;
  anon_struct_40_5_444f9c93 *__begin1;
  anon_struct_40_5_444f9c93 (*__range1) [18];
  char *local_200;
  anon_struct_40_5_444f9c93 *AE;
  anon_struct_40_5_444f9c93 *__end2;
  anon_struct_40_5_444f9c93 *__begin2;
  anon_struct_40_5_444f9c93 (*__range2) [18];
  StringRef ArchExtBase;
  AArch64 *local_1a8;
  StringRef ArchExt_local;
  AArch64 *local_168;
  char *local_160;
  anon_struct_40_5_444f9c93 (*local_158) [18];
  char *local_150;
  anon_struct_40_5_444f9c93 (*local_148) [18];
  char *local_140;
  AArch64 *local_138;
  char *local_130;
  char *local_128;
  size_t *local_120;
  char *local_118;
  size_t *local_110;
  char *local_108;
  size_t *local_100;
  AArch64 **local_f8;
  size_t local_f0;
  char *local_e8;
  unsigned_long local_e0 [3];
  AArch64 **local_c8;
  undefined1 local_c0 [16];
  char *local_b0;
  AArch64 *local_a8;
  undefined1 *local_a0;
  AArch64 **local_98;
  anon_struct_40_5_444f9c93 (*local_90) [18];
  char *local_88;
  AArch64 **local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  AArch64 *local_58;
  int local_4c;
  char *local_48;
  anon_struct_40_5_444f9c93 (*local_40) [18];
  AArch64 *local_38;
  int local_2c;
  char *local_28;
  size_t local_20;
  AArch64 *local_18;
  int local_c;
  
  ArchExt_local.Data = ArchExt.Data;
  local_120 = &ArchExtBase.Length;
  local_128 = "no";
  ArchExtBase.Length = (size_t)anon_var_dwarf_2b9085;
  local_1a8 = this;
  local_e8 = (char *)strlen("no");
  local_f0 = ArchExtBase.Length;
  local_f8 = &local_1a8;
  local_259 = false;
  if (local_e8 <= ArchExt_local.Data) {
    local_18 = local_1a8;
    local_20 = ArchExtBase.Length;
    local_28 = local_e8;
    if (local_e8 == (char *)0x0) {
      local_c = 0;
    }
    else {
      local_c = memcmp(local_1a8,(void *)ArchExtBase.Length,(size_t)local_e8);
    }
    local_259 = local_c == 0;
  }
  if (local_259) {
    local_c8 = &local_1a8;
    local_e0[2] = 2;
    local_e0[1] = 0xffffffffffffffff;
    puVar2 = std::min<unsigned_long>(local_e0 + 2,(unsigned_long *)&ArchExt_local);
    local_e0[2] = *puVar2;
    pAVar3 = local_1a8 + local_e0[2];
    local_e0[0] = (long)ArchExt_local.Data - local_e0[2];
    puVar2 = std::min<unsigned_long>(local_e0 + 1,local_e0);
    ArchExtBase.Data = (char *)*puVar2;
    local_a0 = local_c0;
    local_b0 = ArchExtBase.Data;
    local_a8 = pAVar3;
    for (__end2 = (anon_struct_40_5_444f9c93 *)(anonymous_namespace)::AArch64ARCHExtNames;
        pcVar1 = ArchExtBase.Data,
        __end2 != (anon_struct_40_5_444f9c93 *)&testing::internal::ExpectationBase::vtable;
        __end2 = __end2 + 1) {
      bVar4 = false;
      if (__end2->NegFeature != (char *)0x0) {
        SVar5 = anon_unknown.dwarf_2b9344::anon_struct_40_5_444f9c93::getName(__end2);
        __range1 = (anon_struct_40_5_444f9c93 (*) [18])SVar5.Data;
        local_200 = (char *)SVar5.Length;
        local_130 = pcVar1;
        local_148 = __range1;
        local_140 = local_200;
        local_158 = __range1;
        local_150 = local_200;
        local_90 = __range1;
        local_88 = local_200;
        local_98 = &local_138;
        bVar4 = false;
        local_138 = pAVar3;
        if (pcVar1 == local_200) {
          local_40 = __range1;
          local_48 = local_200;
          local_38 = pAVar3;
          if (local_200 == (char *)0x0) {
            local_2c = 0;
          }
          else {
            local_2c = memcmp(pAVar3,__range1,(size_t)local_200);
          }
          bVar4 = local_2c == 0;
        }
      }
      if (bVar4) {
        local_118 = __end2->NegFeature;
        local_110 = &ArchExt_local.Length;
        ArchExt_local.Length = (size_t)local_118;
        if (local_118 == (char *)0x0) {
          return unique0x10000310;
        }
        strlen(local_118);
        return stack0xfffffffffffffe68;
      }
    }
  }
  __end1 = (anon_struct_40_5_444f9c93 *)(anonymous_namespace)::AArch64ARCHExtNames;
  while( true ) {
    pcVar1 = ArchExt_local.Data;
    pAVar3 = local_1a8;
    if (__end1 == (anon_struct_40_5_444f9c93 *)&testing::internal::ExpectationBase::vtable) {
      memset(&ArchExt_local.Length,0,0x10);
      StringRef::StringRef((StringRef *)&ArchExt_local.Length);
      return stack0xfffffffffffffe68;
    }
    bVar4 = false;
    if (__end1->Feature != (char *)0x0) {
      SVar5 = anon_unknown.dwarf_2b9344::anon_struct_40_5_444f9c93::getName(__end1);
      local_248 = SVar5.Data;
      local_240 = (char *)SVar5.Length;
      local_168 = pAVar3;
      local_160 = pcVar1;
      local_78 = local_248;
      local_70 = local_240;
      local_80 = &local_168;
      bVar4 = false;
      if (pcVar1 == local_240) {
        local_58 = pAVar3;
        local_60 = local_248;
        local_68 = local_240;
        if (local_240 == (char *)0x0) {
          local_4c = 0;
        }
        else {
          local_4c = memcmp(pAVar3,local_248,(size_t)local_240);
        }
        bVar4 = local_4c == 0;
      }
    }
    if (bVar4) break;
    __end1 = __end1 + 1;
  }
  local_108 = __end1->Feature;
  local_100 = &ArchExt_local.Length;
  ArchExt_local.Length = (size_t)local_108;
  if (local_108 == (char *)0x0) {
    return unique0x10000320;
  }
  strlen(local_108);
  return stack0xfffffffffffffe68;
}

Assistant:

StringRef llvm::AArch64::getArchExtFeature(StringRef ArchExt) {
  if (ArchExt.startswith("no")) {
    StringRef ArchExtBase(ArchExt.substr(2));
    for (const auto &AE : AArch64ARCHExtNames) {
      if (AE.NegFeature && ArchExtBase == AE.getName())
        return StringRef(AE.NegFeature);
    }
  }

  for (const auto &AE : AArch64ARCHExtNames)
    if (AE.Feature && ArchExt == AE.getName())
      return StringRef(AE.Feature);
  return StringRef();
}